

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<int,double>
          (string *__return_storage_ptr__,internal *this,int *value,double *param_2)

{
  double *param_1_local;
  int *value_local;
  
  PrintToString<int>(__return_storage_ptr__,(int *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}